

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  ClockingDirectionSyntax *args_1;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *args_2;
  ClockingItemSyntax *pCVar1;
  DeepCloneVisitor visitor;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  args_1 = (ClockingDirectionSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x50),(DeepCloneVisitor *)&local_40,
                      (BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::AttributeSpecSyntax>
                     ((SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)(__fn + 0x58),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClockingItemSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ClockingDirectionSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,args_1,args_2,&local_40);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClockingItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClockingItemSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<ClockingDirectionSyntax>(*node.direction, alloc),
        *deepClone(node.decls, alloc),
        node.semi.deepClone(alloc)
    );
}